

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

Bbl_Man_t * Bbl_ManStart(char *pName)

{
  int iVar1;
  Bbl_Man_t *pBVar2;
  size_t sVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  
  pBVar2 = (Bbl_Man_t *)calloc(1,0x4d0);
  if (pName == (char *)0x0) {
    pVVar4 = (Vec_Str_t *)calloc(1,0x10);
  }
  else {
    sVar3 = strlen(pName);
    uVar8 = (int)sVar3 + 1;
    pVVar4 = (Vec_Str_t *)malloc(0x10);
    iVar1 = 0x10;
    if (0xe < (uVar8 | 3)) {
      iVar1 = (uVar8 & 0xfffffffc) + 4;
    }
    pVVar4->nCap = iVar1;
    pcVar5 = (char *)malloc((long)iVar1);
    pVVar4->pArray = pcVar5;
    pVVar4->nSize = iVar1;
    strcpy(pcVar5,pName);
  }
  pBVar2->pName = pVVar4;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 0x10000;
  pVVar4->nSize = 0;
  pcVar5 = (char *)malloc(0x10000);
  pVVar4->pArray = pcVar5;
  pBVar2->pObjs = pVVar4;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 0x10000;
  pVVar4->nSize = 0;
  pcVar5 = (char *)malloc(0x10000);
  pVVar4->pArray = pcVar5;
  pBVar2->pFncs = pVVar4;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 0x10000;
  pcVar5 = (char *)malloc(0x10000);
  pVVar4->pArray = pcVar5;
  pBVar2->pEnts = pVVar4;
  pVVar4->nSize = 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x400;
  piVar7 = (int *)calloc(1,0x1000);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 0x400;
  pBVar2->vId2Obj = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x400;
  piVar7 = (int *)calloc(1,0x1000);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 0x400;
  pBVar2->vFaninNums = pVVar6;
  return pBVar2;
}

Assistant:

Bbl_Man_t * Bbl_ManStart( char * pName )
{
    Bbl_Man_t * p;
    int nLength;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    nLength = pName? 4 * ((strlen(pName) + 1) / 4 + 1) : 0;
    p->pName  = Vec_StrAlloc( nLength );
    p->pName->nSize = p->pName->nCap;
    if ( pName )
        strcpy( p->pName->pArray, pName );
    p->pObjs = Vec_StrAlloc( 1 << 16 );
    p->pFncs = Vec_StrAlloc( 1 << 16 );
    p->pEnts = Vec_StrAlloc( 1 << 16 ); p->pEnts->nSize = 1;
    p->vId2Obj = Vec_IntStart( 1 << 10 );
    p->vFaninNums = Vec_IntStart( 1 << 10 );
    return p;
}